

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaK_setoneret(FuncState *fs,expdesc *e)

{
  int iVar1;
  Instruction *pIVar2;
  
  if (e->k == VVARARG) {
    pIVar2 = fs->f->code;
    iVar1 = (e->u).s.info;
    pIVar2[iVar1] = pIVar2[iVar1] & 0x7fffff | 0x1000000;
    e->k = VRELOCABLE;
  }
  else if (e->k == VCALL) {
    e->k = VNONRELOC;
    (e->u).s.info = fs->f->code[(e->u).s.info] >> 6 & 0xff;
    return;
  }
  return;
}

Assistant:

static void luaK_setoneret(FuncState*fs,expdesc*e){
if(e->k==VCALL){
e->k=VNONRELOC;
e->u.s.info=GETARG_A(getcode(fs,e));
}
else if(e->k==VVARARG){
SETARG_B(getcode(fs,e),2);
e->k=VRELOCABLE;
}
}